

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  ulong __size;
  int local_70;
  uint local_6c;
  int local_60;
  uint local_5c;
  void *tmp_2;
  void *tmp_1;
  size_t delimiter_count;
  size_t size;
  void *tmp;
  Scanner *scanner;
  uint length_local;
  char *buffer_local;
  void *payload_local;
  
  **(undefined4 **)((long)payload + 8) = 0;
  **payload = 0;
  if (*(int *)(*payload + 4) == **payload) {
    if ((uint)(**payload * 2) < 0x10) {
      local_5c = 0x10;
    }
    else {
      local_5c = **payload << 1;
    }
    pvVar4 = realloc(*(void **)(*payload + 8),(ulong)local_5c << 1);
    if (pvVar4 == (void *)0x0) {
      __assert_fail("tmp != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1d3,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
    *(void **)(*payload + 8) = pvVar4;
    if ((uint)(**payload * 2) < 0x10) {
      local_60 = 0x10;
    }
    else {
      local_60 = **payload << 1;
    }
    *(int *)(*payload + 4) = local_60;
  }
  lVar3 = *(long *)(*payload + 8);
  uVar2 = **payload;
  **payload = uVar2 + 1;
  *(undefined2 *)(lVar3 + (ulong)uVar2 * 2) = 0;
  if (length != 0) {
    delimiter_count = 1;
    bVar1 = *buffer;
    __size = (ulong)bVar1;
    if (__size != 0) {
      if (*(uint *)(*(long *)((long)payload + 8) + 4) < __size) {
        pvVar4 = realloc(*(void **)(*(long *)((long)payload + 8) + 8),__size);
        if (pvVar4 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1da,
                        "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                       );
        }
        *(void **)(*(long *)((long)payload + 8) + 8) = pvVar4;
        *(uint *)(*(long *)((long)payload + 8) + 4) = (uint)bVar1;
      }
      **(uint **)((long)payload + 8) = (uint)bVar1;
      memcpy(*(void **)(*(long *)((long)payload + 8) + 8),buffer + 1,__size);
      delimiter_count = __size + 1;
    }
    for (; delimiter_count < length; delimiter_count = delimiter_count + 1) {
      if (*(int *)(*payload + 4) == **payload) {
        if ((uint)(**payload * 2) < 0x10) {
          local_6c = 0x10;
        }
        else {
          local_6c = **payload << 1;
        }
        pvVar4 = realloc(*(void **)(*payload + 8),(ulong)local_6c << 1);
        if (pvVar4 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1e1,
                        "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                       );
        }
        *(void **)(*payload + 8) = pvVar4;
        if ((uint)(**payload * 2) < 0x10) {
          local_70 = 0x10;
        }
        else {
          local_70 = **payload << 1;
        }
        *(int *)(*payload + 4) = local_70;
      }
      bVar1 = buffer[delimiter_count];
      lVar3 = *(long *)(*payload + 8);
      uVar2 = **payload;
      **payload = uVar2 + 1;
      *(ushort *)(lVar3 + (ulong)uVar2 * 2) = (ushort)bVar1;
    }
    if (delimiter_count != length) {
      __assert_fail("size == length",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1e4,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
  }
  return;
}

Assistant:

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,
                                                       const char *buffer,
                                                       unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    VEC_CLEAR(scanner->delimiters);
    VEC_CLEAR(scanner->indents);
    VEC_PUSH(scanner->indents, 0);

    if (length > 0) {
        size_t size = 0;

        size_t delimiter_count = (uint8_t)buffer[size++];
        if (delimiter_count > 0) {
            VEC_GROW(scanner->delimiters, delimiter_count);
            scanner->delimiters->len = delimiter_count;
            memcpy(scanner->delimiters->data, &buffer[size], delimiter_count);
            size += delimiter_count;
        }

        for (; size < length; size++) {
            VEC_PUSH(scanner->indents, (unsigned char)buffer[size]);
        }

        assert(size == length);
    }
}